

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O1

void __thiscall ON_AerialPhotoImage::ON_AerialPhotoImage(ON_AerialPhotoImage *this)

{
  ON_wString::ON_wString(&this->m_name);
  (this->m_id).Data1 = 0;
  (this->m_id).Data2 = 0;
  (this->m_id).Data3 = 0;
  (this->m_id).Data4[0] = '\0';
  (this->m_id).Data4[1] = '\0';
  (this->m_id).Data4[2] = '\0';
  (this->m_id).Data4[3] = '\0';
  (this->m_id).Data4[4] = '\0';
  (this->m_id).Data4[5] = '\0';
  (this->m_id).Data4[6] = '\0';
  (this->m_id).Data4[7] = '\0';
  ON_AerialPhotoCameraPosition::ON_AerialPhotoCameraPosition(&this->m_camera_position);
  ON_AerialPhotoImageFrustum::ON_AerialPhotoImageFrustum(&this->m_image_frustum);
  ON_wString::ON_wString(&this->m_image_file_name);
  this->m_image_width_pixels = 0;
  this->m_image_height_pixels = 0;
  return;
}

Assistant:

ON_AerialPhotoImage::ON_AerialPhotoImage()
: m_id(ON_nil_uuid)
, m_image_width_pixels(0)
, m_image_height_pixels(0)
{
}